

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

Curve * __thiscall ON_ShutLining::FindCurve(ON_ShutLining *this,ON_UUID *id)

{
  int iVar1;
  CImplSL *pCVar2;
  bool bVar3;
  Curve *this_00;
  CurveIterator it;
  CurveIterator local_30;
  ON_UUID local_28;
  
  CurveIterator::CurveIterator(&local_30,this);
  do {
    iVar1 = (local_30.m_impl)->m_index;
    pCVar2 = (local_30.m_impl)->m_sl->m_impl_sl;
    if ((pCVar2->m_curves).m_count <= iVar1) {
LAB_00521553:
      this_00 = (Curve *)0x0;
      break;
    }
    (local_30.m_impl)->m_index = iVar1 + 1;
    this_00 = (pCVar2->m_curves).m_a[iVar1];
    if (this_00 == (Curve *)0x0) goto LAB_00521553;
    local_28 = Curve::Id(this_00);
    bVar3 = ::operator==(&local_28,id);
  } while (!bVar3);
  CurveIterator::~CurveIterator(&local_30);
  return this_00;
}

Assistant:

ON_ShutLining::Curve* ON_ShutLining::FindCurve(const ON_UUID& id) const
{
  auto it = GetCurveIterator();
  while (Curve* curve = it.Next())
  {
    if (curve->Id() == id)
      return curve;
  }

  return nullptr;
}